

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_function.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string input;
  enable_if_type<_std::is_void<result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>_>
  result;
  string local_70 [32];
  enable_if_type<_std::is_void<result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>_>
  local_50;
  
  std::__cxx11::string::string(local_70,"./sample/lipsum.txt",(allocator *)&local_50);
  bm::GenericBench<std::chrono::_V2::steady_clock>::
  mark<unsigned_long(&)(std::__cxx11::string_const&),std::__cxx11::string&>
            (&local_50,(GenericBench<std::chrono::_V2::steady_clock> *)count_words,
             (_func_unsigned_long_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)local_70,in_RCX);
  poVar1 = bm::operator<<((ostream *)&std::cout,&local_50.first);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Retval = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Function_base::~_Function_base(&local_50.first._overflow_callback.super__Function_base);
  std::__cxx11::string::~string(local_70);
  return 0;
}

Assistant:

int main()
{
    std::string input("./sample/lipsum.txt");
    auto result = Bench::mark(count_words, input);
    std::cout << result.first << std::endl;
    std::cout << "Retval = " << result.second << std::endl;
    return 0;
}